

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O0

mh_int_t mh_assoc_put_slot(mh_assoc_t *h,assoc_val **node,void *arg)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  mh_int_t inc_00;
  mh_int_t save_i;
  uint local_30;
  mh_int_t inc;
  mh_int_t i;
  mh_int_t k;
  void *arg_local;
  assoc_val **node_local;
  mh_assoc_t *h_local;
  
  uVar2 = PMurHash32(0xd,((*node)->key).id,((*node)->key).id_len);
  local_30 = uVar2 % h->n_buckets;
  inc_00 = uVar2 % (h->n_buckets - 1) + 1;
  while (uVar1 = local_30, (h->b[local_30 >> 4] & 1 << ((byte)local_30 & 0xf)) != 0) {
    iVar3 = mh_cmp_eq(node,h->p + local_30,arg);
    if (iVar3 != 0) {
      return local_30;
    }
    h->b[local_30 >> 4] = 1 << (((byte)local_30 & 0xf) + 0x10 & 0x1f) | h->b[local_30 >> 4];
    local_30 = mh_assoc_next_slot(local_30,inc_00,h->n_buckets);
  }
  do {
    if ((h->b[local_30 >> 4] & 1 << (((byte)local_30 & 0xf) + 0x10 & 0x1f)) == 0) {
      return uVar1;
    }
    local_30 = mh_assoc_next_slot(local_30,inc_00,h->n_buckets);
  } while (((h->b[local_30 >> 4] & 1 << ((byte)local_30 & 0xf)) == 0) ||
          (iVar3 = mh_cmp_eq(h->p + local_30,node,arg), iVar3 == 0));
  return local_30;
}

Assistant:

static inline mh_int_t
_mh(put_slot)(struct _mh(t) *h, const mh_node_t *node,
	      mh_arg_t arg)
{
	(void) arg;

	mh_int_t k = mh_hash(node, arg); /* hash key */
	mh_int_t i = k % h->n_buckets; /* offset in the hash table. */
	mh_int_t inc = 1 + k % (h->n_buckets - 1); /* overflow chain increment. */

	/* Skip through all collisions. */
	while (mh_exist(h, i)) {
		if (mh_eq(node, mh_node(h, i), arg))
			return i;               /* Found a duplicate. */
		/*
		 * Mark this link as part of a collision chain. The
		 * chain always ends with a non-marked link.
		 * Note: the collision chain for this key may share
		 * links with collision chains of other keys.
		 */
		mh_setdirty(h, i);
		i = _mh(next_slot)(i, inc, h->n_buckets);
	}
	/*
	 * Found an unused, but possibly dirty slot. Use it.
	 * However, if this is a dirty slot, first check that
	 * there are no duplicates down the collision chain. The
	 * current link can also be from a collision chain of some
	 * other key, but this is can't be established, so check
	 * anyway.
	 */
	mh_int_t save_i = i;
	while (mh_dirty(h, i)) {
		i = _mh(next_slot)(i, inc, h->n_buckets);

		if (mh_exist(h, i) && mh_eq(mh_node(h, i), node, arg))
			return i;               /* Found a duplicate. */
	}
	/* Reached the end of the collision chain: no duplicates. */
	return save_i;
}